

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

PropertyBase *
Protocol::MQTT::V5::
TypedProperty<(Protocol::MQTT::V5::PropertyType)9,_Protocol::MQTT::Common::DynamicBinaryData>::
allocateProp(void)

{
  PropertyBase *pPVar1;
  
  pPVar1 = (PropertyBase *)operator_new(0x30);
  pPVar1->type = '\t';
  pPVar1->next = (PropertyBase *)0x0;
  pPVar1->heapAllocated = true;
  (pPVar1->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_getSize_0011f4f8;
  *(undefined ***)&pPVar1->field_0x19 = &PTR_getSize_0011f4a8;
  *(undefined2 *)((long)&pPVar1[1].super_Serializable._vptr_Serializable + 1) = 0;
  *(undefined8 *)((long)&pPVar1[1].super_Serializable._vptr_Serializable + 3) = 0;
  return pPVar1;
}

Assistant:

static PropertyBase * allocateProp() { return new Property<T>(type, T(), true) ; }